

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
erase(Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *this,
     Bucket bucket)

{
  byte bVar1;
  Span *pSVar2;
  size_t to;
  ulong uVar3;
  Span<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *this_00;
  ulong uVar4;
  Span *pSVar5;
  Span *pSVar6;
  Span *fromSpan;
  size_t fromIndex;
  
  to = bucket.index;
  this_00 = bucket.span;
  bVar1 = this_00->offsets[to];
  this_00->offsets[to] = 0xff;
  QArrayDataPointer<QString>::~QArrayDataPointer
            ((QArrayDataPointer<QString> *)(this_00->entries[bVar1].storage.data + 8));
  this_00->entries[bVar1].storage.data[0] = this_00->nextFree;
  this_00->nextFree = bVar1;
  this->size = this->size - 1;
LAB_0049c911:
  pSVar2 = this->spans;
  uVar3 = this->numBuckets >> 7;
  fromSpan = this_00;
  fromIndex = to;
  do {
    do {
      fromIndex = fromIndex + 1;
      if (fromIndex == 0x80) {
        fromSpan = fromSpan + 1;
        if (((long)fromSpan - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar3 == 0) {
          fromSpan = pSVar2;
        }
        fromIndex = 0;
      }
      if (fromSpan->offsets[fromIndex] == 0xff) {
        return;
      }
      uVar4 = ((ulong)*(uint *)fromSpan->entries[fromSpan->offsets[fromIndex]].storage.data ^
              this->seed >> 0x20 ^ this->seed) * -0x2917014799a6026d;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) & this->numBuckets - 1;
      pSVar5 = pSVar2 + (uVar4 >> 7);
      uVar4 = (ulong)((uint)uVar4 & 0x7f);
    } while (uVar4 == fromIndex && pSVar5 == fromSpan);
    do {
      if ((pSVar5 == this_00) && (uVar4 == to)) {
        if (fromSpan == this_00) {
          this_00->offsets[to] = this_00->offsets[fromIndex];
          this_00->offsets[fromIndex] = 0xff;
          to = fromIndex;
          this_00 = fromSpan;
        }
        else {
          Span<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
          moveFromSpan(this_00,fromSpan,fromIndex,to);
          to = fromIndex;
          this_00 = fromSpan;
        }
        goto LAB_0049c911;
      }
      uVar4 = uVar4 + 1;
      if (uVar4 == 0x80) {
        pSVar6 = pSVar5 + 1;
        pSVar5 = pSVar2;
        if (((long)pSVar6 - (long)pSVar2 >> 4) * -0x71c71c71c71c71c7 - uVar3 != 0) {
          pSVar5 = pSVar6;
        }
        uVar4 = 0;
      }
    } while ((pSVar5 != fromSpan) || (uVar4 != fromIndex));
  } while( true );
}

Assistant:

void erase(Bucket bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket.span->hasNode(bucket.index));
        bucket.span->erase(bucket.index);
        --size;

        // re-insert the following entries to avoid holes
        Bucket next = bucket;
        while (true) {
            next.advanceWrapped(this);
            size_t offset = next.offset();
            if (offset == SpanConstants::UnusedEntry)
                return;
            size_t hash = QHashPrivate::calculateHash(next.nodeAtOffset(offset).key, seed);
            Bucket newBucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
            while (true) {
                if (newBucket == next) {
                    // nothing to do, item is at the right plae
                    break;
                } else if (newBucket == bucket) {
                    // move into the hole we created earlier
                    if (next.span == bucket.span) {
                        bucket.span->moveLocal(next.index, bucket.index);
                    } else {
                        // move between spans, more expensive
                        bucket.span->moveFromSpan(*next.span, next.index, bucket.index);
                    }
                    bucket = next;
                    break;
                }
                newBucket.advanceWrapped(this);
            }
        }
    }